

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
::~raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                *this)

{
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *this_local;
  
  destroy_slots(this);
  std::
  tuple<unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  ::~tuple(&this->settings_);
  return;
}

Assistant:

~raw_hash_set() { destroy_slots(); }